

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error TT_Access_Glyph_Frame
                   (TT_Loader loader,FT_UInt glyph_index,FT_ULong offset,FT_UInt byte_count)

{
  FT_Stream stream_00;
  FT_Stream stream;
  FT_Error error;
  FT_UInt byte_count_local;
  FT_ULong offset_local;
  FT_UInt glyph_index_local;
  TT_Loader loader_local;
  
  stream_00 = loader->stream;
  stream._0_4_ = FT_Stream_Seek(stream_00,offset);
  if (((FT_Error)stream == 0) &&
     (stream._0_4_ = FT_Stream_EnterFrame(stream_00,(ulong)byte_count), (FT_Error)stream == 0)) {
    loader->cursor = stream_00->cursor;
    loader->limit = stream_00->limit;
    return 0;
  }
  return (FT_Error)stream;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  TT_Access_Glyph_Frame( TT_Loader  loader,
                         FT_UInt    glyph_index,
                         FT_ULong   offset,
                         FT_UInt    byte_count )
  {
    FT_Error   error;
    FT_Stream  stream = loader->stream;

    FT_UNUSED( glyph_index );


    /* the following line sets the `error' variable through macros! */
    if ( FT_STREAM_SEEK( offset ) || FT_FRAME_ENTER( byte_count ) )
      return error;

    loader->cursor = stream->cursor;
    loader->limit  = stream->limit;

    return FT_Err_Ok;
  }